

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

bool __thiscall Minisat::DoubleOption::parse(DoubleOption *this,char *str)

{
  char *pcVar1;
  double dVar2;
  char cVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  bool bVar7;
  double dVar8;
  char *end;
  char *local_20;
  
  if (*str != '-') {
    return false;
  }
  pcVar6 = str + (*str == '-');
  pcVar4 = (this->super_Option).name;
  cVar3 = *pcVar4;
  bVar7 = cVar3 == '\0';
  if (bVar7) {
    lVar5 = 0;
LAB_00110fb5:
    pcVar6 = pcVar6 + lVar5;
  }
  else if (*pcVar6 == cVar3) {
    lVar5 = 1;
    do {
      cVar3 = pcVar4[lVar5];
      bVar7 = cVar3 == '\0';
      if (bVar7) goto LAB_00110fb5;
      pcVar1 = pcVar6 + lVar5;
      lVar5 = lVar5 + 1;
    } while (*pcVar1 == cVar3);
  }
  else {
    bVar7 = false;
  }
  if (!bVar7) {
    return false;
  }
  if (*pcVar6 != '=') {
    return false;
  }
  dVar8 = strtod(pcVar6 + (*pcVar6 == '='),&local_20);
  bVar7 = local_20 != (char *)0x0;
  if (!bVar7) {
    return bVar7;
  }
  dVar2 = (this->range).end;
  if (dVar2 <= dVar8) {
    if ((this->range).end_inclusive == true) {
      if ((dVar8 == dVar2) && (!NAN(dVar8) && !NAN(dVar2))) goto LAB_00111009;
    }
    parse();
  }
  else {
LAB_00111009:
    dVar2 = (this->range).begin;
    if (dVar2 < dVar8) {
LAB_00111024:
      this->value = dVar8;
      return bVar7;
    }
    if ((this->range).begin_inclusive == true) {
      if ((dVar8 == dVar2) && (!NAN(dVar8) && !NAN(dVar2))) goto LAB_00111024;
    }
  }
  parse();
  if (Option::getOptionList()::options == '\0') {
    Option::getOptionList();
  }
  return true;
}

Assistant:

Int64Range(int64_t b, int64_t e) : begin(b), end(e) {}